

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O0

bool __thiscall ON_BrepTrim::Read(ON_BrepTrim *this,ON_BinaryArchive *file)

{
  ON_Interval domain;
  ON_Interval proxy_curve_subdomain;
  bool bVar1;
  int iVar2;
  uint uVar3;
  ON__UINT8 local_b8 [7];
  bool bProxyCurveIsReversed;
  uchar b [24];
  undefined1 local_90 [8];
  ON_Interval d_1;
  undefined1 local_60 [8];
  ON_Interval d;
  undefined1 local_48 [3];
  bool rc;
  int i;
  ON_3dPoint P [2];
  ON_BinaryArchive *file_local;
  ON_BrepTrim *this_local;
  
  P[1].z = (double)file;
  d.m_t[1]._3_1_ = ON_BinaryArchive::ReadInt(file,&this->m_trim_index);
  if ((bool)d.m_t[1]._3_1_) {
    d.m_t[1]._3_1_ = ON_BinaryArchive::ReadInt((ON_BinaryArchive *)P[1].z,&this->m_c2i);
  }
  if ((bool)d.m_t[1]._3_1_ != false) {
    ON_Interval::ON_Interval((ON_Interval *)local_60);
    d.m_t[1]._3_1_ =
         ON_BinaryArchive::ReadInterval((ON_BinaryArchive *)P[1].z,(ON_Interval *)local_60);
    if ((bool)d.m_t[1]._3_1_) {
      proxy_curve_subdomain.m_t[1] = d.m_t[0];
      proxy_curve_subdomain.m_t[0] = (double)local_60;
      ON_CurveProxy::SetProxyCurveDomain(&this->super_ON_CurveProxy,proxy_curve_subdomain);
      d_1.m_t[1] = (double)local_60;
      domain.m_t[1] = d.m_t[0];
      domain.m_t[0] = (double)local_60;
      ON_CurveProxy::SetDomain(&this->super_ON_CurveProxy,domain);
    }
  }
  if ((d.m_t[1]._3_1_ & 1) != 0) {
    d.m_t[1]._3_1_ = ON_BinaryArchive::ReadInt((ON_BinaryArchive *)P[1].z,&this->m_ei);
  }
  if ((d.m_t[1]._3_1_ & 1) != 0) {
    d.m_t[1]._3_1_ = ON_BinaryArchive::ReadInt((ON_BinaryArchive *)P[1].z,2,this->m_vi);
  }
  if ((d.m_t[1]._3_1_ & 1) != 0) {
    d.m_t[1]._4_4_ = (uint)(this->m_bRev3d & 1);
    d.m_t[1]._3_1_ =
         ON_BinaryArchive::ReadInt((ON_BinaryArchive *)P[1].z,(ON__INT32 *)((long)d.m_t + 0xc));
    if ((bool)d.m_t[1]._3_1_) {
      this->m_bRev3d = d.m_t[1]._4_4_ != 0;
    }
  }
  d.m_t[1]._4_4_ = 0;
  if ((d.m_t[1]._3_1_ & 1) != 0) {
    d.m_t[1]._3_1_ =
         ON_BinaryArchive::ReadInt((ON_BinaryArchive *)P[1].z,(ON__INT32 *)((long)d.m_t + 0xc));
  }
  switch(d.m_t[1]._4_4_) {
  case 0:
    this->m_type = unknown;
    break;
  case 1:
    this->m_type = boundary;
    break;
  case 2:
    this->m_type = mated;
    break;
  case 3:
    this->m_type = seam;
    break;
  case 4:
    this->m_type = singular;
  }
  d.m_t[1]._4_4_ = 0;
  if ((d.m_t[1]._3_1_ & 1) != 0) {
    d.m_t[1]._3_1_ =
         ON_BinaryArchive::ReadInt((ON_BinaryArchive *)P[1].z,(ON__INT32 *)((long)d.m_t + 0xc));
  }
  switch(d.m_t[1]._4_4_) {
  case 0:
    this->m_iso = not_iso;
    break;
  case 1:
    this->m_iso = x_iso;
    break;
  case 2:
    this->m_iso = y_iso;
    break;
  case 3:
    this->m_iso = W_iso;
    break;
  case 4:
    this->m_iso = S_iso;
    break;
  case 5:
    this->m_iso = E_iso;
    break;
  case 6:
    this->m_iso = N_iso;
  }
  if ((d.m_t[1]._3_1_ & 1) != 0) {
    d.m_t[1]._3_1_ = ON_BinaryArchive::ReadInt((ON_BinaryArchive *)P[1].z,&this->m_li);
  }
  if ((d.m_t[1]._3_1_ & 1) != 0) {
    d.m_t[1]._3_1_ = ON_BinaryArchive::ReadDouble((ON_BinaryArchive *)P[1].z,2,this->m_tolerance);
  }
  iVar2 = ON_BinaryArchive::Archive3dmVersion((ON_BinaryArchive *)P[1].z);
  if ((iVar2 < 3) ||
     (uVar3 = ON_BinaryArchive::ArchiveOpenNURBSVersion((ON_BinaryArchive *)P[1].z),
     uVar3 < 0xbeee764)) {
    if ((d.m_t[1]._3_1_ & 1) != 0) {
      d.m_t[1]._3_1_ =
           ON_BinaryArchive::ReadPoint((ON_BinaryArchive *)P[1].z,(ON_3dPoint *)local_48);
    }
    if ((d.m_t[1]._3_1_ & 1) != 0) {
      d.m_t[1]._3_1_ = ON_BinaryArchive::ReadPoint((ON_BinaryArchive *)P[1].z,(ON_3dPoint *)&P[0].z)
      ;
    }
  }
  else {
    _local_90 = ON_CurveProxy::ProxyCurveDomain(&this->super_ON_CurveProxy);
    if (((d.m_t[1]._3_1_ & 1) != 0) &&
       (d.m_t[1]._3_1_ =
             ON_BinaryArchive::ReadInterval((ON_BinaryArchive *)P[1].z,(ON_Interval *)local_90),
       !(bool)d.m_t[1]._3_1_)) {
      join_0x00001240_0x00001200_ = ON_CurveProxy::ProxyCurveDomain(&this->super_ON_CurveProxy);
      _local_90 = join_0x00001240_0x00001200_;
    }
    memset(local_b8,0,0x18);
    bVar1 = false;
    if ((((d.m_t[1]._3_1_ & 1) != 0) &&
        (d.m_t[1]._3_1_ = ON_BinaryArchive::ReadChar((ON_BinaryArchive *)P[1].z,8,local_b8),
        (bool)d.m_t[1]._3_1_)) && (local_b8[0] == '\x01')) {
      bVar1 = true;
    }
    if ((d.m_t[1]._3_1_ & 1) != 0) {
      d.m_t[1]._3_1_ = ON_BinaryArchive::ReadChar((ON_BinaryArchive *)P[1].z,0x18,local_b8);
    }
    if (bVar1) {
      ON_CurveProxy::Reverse(&this->super_ON_CurveProxy);
    }
    ON_CurveProxy::SetDomain(&this->super_ON_CurveProxy,_local_90);
  }
  if ((d.m_t[1]._3_1_ & 1) != 0) {
    d.m_t[1]._3_1_ =
         ON_BinaryArchive::ReadDouble((ON_BinaryArchive *)P[1].z,&this->m__legacy_2d_tol);
  }
  if ((d.m_t[1]._3_1_ & 1) != 0) {
    d.m_t[1]._3_1_ =
         ON_BinaryArchive::ReadDouble((ON_BinaryArchive *)P[1].z,&this->m__legacy_3d_tol);
  }
  return (bool)(d.m_t[1]._3_1_ & 1);
}

Assistant:

bool ON_BrepTrim::Read( ON_BinaryArchive& file )
{
  ON_3dPoint P[2];
  int i;
  bool rc = file.ReadInt( &m_trim_index );
  if ( rc )
    rc = file.ReadInt( &m_c2i );
  if ( rc )
  {
    ON_Interval d;
    rc = file.ReadInterval( d );
    if (rc)
    {
      SetProxyCurveDomain(d);
      SetDomain(d);
    }
  }
  if ( rc )
    rc = file.ReadInt( &m_ei );
  if ( rc )
    rc = file.ReadInt( 2, m_vi );
  if ( rc )
  {
    i = m_bRev3d;
    rc = file.ReadInt( &i );
    if (rc)
      m_bRev3d = (i!=0);
  }

  i = unknown;
  if ( rc )
    rc = file.ReadInt( &i );
  switch (i) {
  case unknown:
    m_type = unknown;
    break;
  case boundary:
    m_type = boundary;
    break;
  case mated:
    m_type = mated;
    break;
  case seam:
    m_type = seam;
    break;
  case singular:
    m_type = singular;
    break;
  }

  i = ON_Surface::not_iso;
  if ( rc )
    rc = file.ReadInt( &i );
  switch(i) {
  case ON_Surface::not_iso:
    m_iso = ON_Surface::not_iso;
    break;
  case ON_Surface::x_iso:
    m_iso = ON_Surface::x_iso;
    break;
  case ON_Surface::y_iso:
    m_iso = ON_Surface::y_iso;
    break;
  case ON_Surface::W_iso:
    m_iso = ON_Surface::W_iso;
    break;
  case ON_Surface::S_iso:
    m_iso = ON_Surface::S_iso;
    break;
  case ON_Surface::E_iso:
    m_iso = ON_Surface::E_iso;
    break;
  case ON_Surface::N_iso:
    m_iso = ON_Surface::N_iso;
    break;
  }

  if ( rc )
    rc = file.ReadInt( &m_li );
  if ( rc )
    rc = file.ReadDouble( 2, m_tolerance );
  if ( file.Archive3dmVersion() >= 3 && file.ArchiveOpenNURBSVersion() >= 200206180 )
  {
    // read trim proxy curve information added in version 200206180
    ON_Interval d = ProxyCurveDomain();
    if (rc )
    {
      rc = file.ReadInterval( d );
      if ( !rc )
        d = ProxyCurveDomain();
    }
    unsigned char b[24];
    memset(b,0,sizeof(b));
    bool bProxyCurveIsReversed = false;
    if (rc)
    {
      rc = file.ReadChar(8,b);
      if (rc && b[0] == 1 )
        bProxyCurveIsReversed = true;
    }
    if (rc)
      rc = file.ReadChar(24,b);

    if ( bProxyCurveIsReversed )
      ON_CurveProxy::Reverse();
    SetDomain(d);
  }
  else
  {
    if ( rc )
      rc = file.ReadPoint( P[0] ); //m_P[0] );
    if ( rc )
      rc = file.ReadPoint( P[1] ); //m_P[1] );
  }
  if ( rc )
    rc = file.ReadDouble( &m__legacy_2d_tol );
  if ( rc )
    rc = file.ReadDouble( &m__legacy_3d_tol );
  return rc;
}